

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binding_map.cpp
# Opt level: O3

bool __thiscall r_exec::HLPBindingMap::need_binding(HLPBindingMap *this,Code *pattern)

{
  bool bVar1;
  byte bVar2;
  short sVar3;
  int iVar4;
  undefined8 in_RAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ushort uVar5;
  Atom p_atom;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  (*(pattern->super__Object)._vptr__Object[4])(pattern,0);
  sVar3 = r_code::Atom::asOpcode();
  if (sVar3 != Opcodes::Ont) {
    (*(pattern->super__Object)._vptr__Object[4])(pattern,0);
    sVar3 = r_code::Atom::asOpcode();
    if (sVar3 != Opcodes::Ent) {
      (*(pattern->super__Object)._vptr__Object[4])(pattern,0);
      sVar3 = r_code::Atom::asOpcode();
      if (sVar3 != Opcodes::Mdl) {
        (*(pattern->super__Object)._vptr__Object[4])(pattern,0);
        sVar3 = r_code::Atom::asOpcode();
        if (sVar3 != Opcodes::Cst) {
          iVar4 = (*(pattern->super__Object)._vptr__Object[10])(pattern);
          if ((short)iVar4 != 0) {
            uVar5 = 0;
            do {
              iVar4 = (*(pattern->super__Object)._vptr__Object[9])(pattern,(ulong)uVar5);
              bVar1 = need_binding(this,(Code *)CONCAT44(extraout_var,iVar4));
              if (bVar1) {
                return true;
              }
              uVar5 = uVar5 + 1;
              iVar4 = (*(pattern->super__Object)._vptr__Object[10])(pattern);
            } while (uVar5 < (ushort)iVar4);
          }
          iVar4 = (*(pattern->super__Object)._vptr__Object[6])(pattern);
          if (1 < (ushort)iVar4) {
            uVar5 = 1;
            do {
              iVar4 = (*(pattern->super__Object)._vptr__Object[4])(pattern,(ulong)uVar5);
              uStack_28 = CONCAT44(*(undefined4 *)CONCAT44(extraout_var_00,iVar4),
                                   (undefined4)uStack_28);
              bVar2 = r_code::Atom::getDescriptor();
              if (bVar2 - 0xc6 < 2) {
                bVar2 = r_code::Atom::getAtomCount();
                uVar5 = uVar5 + bVar2;
              }
              else if (bVar2 == 0x86) {
                r_code::Atom::~Atom((Atom *)((long)&uStack_28 + 4));
                return true;
              }
              r_code::Atom::~Atom((Atom *)((long)&uStack_28 + 4));
              uVar5 = uVar5 + 1;
              iVar4 = (*(pattern->super__Object)._vptr__Object[6])(pattern);
            } while (uVar5 < (ushort)iVar4);
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool HLPBindingMap::need_binding(Code *pattern) const
{
    if (pattern->code(0).asOpcode() == Opcodes::Ont ||
        pattern->code(0).asOpcode() == Opcodes::Ent ||
        pattern->code(0).asOpcode() == Opcodes::Mdl ||
        pattern->code(0).asOpcode() == Opcodes::Cst) {
        return false;
    }

    for (uint16_t i = 0; i < pattern->references_size(); ++i) {
        if (need_binding(pattern->get_reference(i))) {
            return true;
        }
    }

    for (uint16_t i = 1; i < pattern->code_size(); ++i) {
        Atom p_atom = pattern->code(i);

        switch (p_atom.getDescriptor()) {
        case Atom::VL_PTR:
            return true;

        case Atom::TIMESTAMP:
        case Atom::STRING:
            i += p_atom.getAtomCount();
            break;

        default:
            break;
        }
    }

    return false;
}